

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O3

void __thiscall OpenMD::FluctuatingChargeLangevin::moveA(FluctuatingChargeLangevin *this)

{
  double dVar1;
  double dVar2;
  pointer ppAVar3;
  Atom *pAVar4;
  DataStoragePointer DVar5;
  Snapshot *pSVar6;
  long lVar7;
  long lVar8;
  Molecule *pMVar9;
  pointer ppAVar10;
  long lVar11;
  double dVar12;
  MoleculeIterator i;
  MoleculeIterator local_18;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_18._M_node = (_Base_ptr)0x0;
    pMVar9 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
    while (pMVar9 != (Molecule *)0x0) {
      ppAVar10 = (pMVar9->fluctuatingCharges_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar3 = (pMVar9->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar10 != ppAVar3) {
        pAVar4 = *ppAVar10;
        while (pAVar4 != (Atom *)0x0) {
          ppAVar10 = ppAVar10 + 1;
          DVar5 = (pAVar4->super_StuntDouble).storage_;
          pSVar6 = ((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_;
          lVar11 = (long)(pAVar4->super_StuntDouble).localIndex_;
          lVar7 = *(long *)((long)&(pSVar6->atomData).flucQPos.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + DVar5);
          lVar8 = *(long *)((long)&(pSVar6->atomData).flucQVel.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + DVar5);
          dVar12 = (*(double *)
                     (*(long *)((long)&(pSVar6->atomData).flucQFrc.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start + DVar5) + lVar11 * 8) *
                   this->dt2_) / pAVar4->chargeMass_ + *(double *)(lVar8 + lVar11 * 8);
          dVar1 = this->dt_;
          dVar2 = *(double *)(lVar7 + lVar11 * 8);
          *(double *)(lVar8 + lVar11 * 8) = dVar12;
          *(double *)(lVar7 + lVar11 * 8) = dVar1 * dVar12 + dVar2;
          if (ppAVar10 == ppAVar3) break;
          pAVar4 = *ppAVar10;
        }
      }
      pMVar9 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeLangevin::moveA() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cpos, cfrc, cmass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel  = atom->getFlucQVel();
        cpos  = atom->getFlucQPos();
        cfrc  = atom->getFlucQFrc();
        cmass = atom->getChargeMass();

        // velocity half step
        cvel += dt2_ * cfrc / cmass;
        // position whole step
        cpos += dt_ * cvel;

        atom->setFlucQVel(cvel);
        atom->setFlucQPos(cpos);
      }
    }
  }